

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_manager.cpp
# Opt level: O0

uint64_t __thiscall cfd::CfdManager::GetSupportedFunction(CfdManager *this)

{
  uint64_t uVar1;
  uint64_t core_functions;
  uint64_t support_function;
  ulong local_10;
  
  uVar1 = core::GetSupportedFunction();
  local_10 = (ulong)((uVar1 & 1) != 0);
  if ((uVar1 & 2) != 0) {
    local_10 = local_10 | 2;
  }
  return local_10;
}

Assistant:

uint64_t CfdManager::GetSupportedFunction() {
  uint64_t support_function = 0;
  // cfdcoreとcfdの両方でサポートしている必要がある。
  uint64_t core_functions = cfd::core::GetSupportedFunction();

#ifndef CFD_DISABLE_BITCOIN
  if (core_functions & cfd::core::LibraryFunction::kEnableBitcoin) {
    support_function |= LibraryFunction::kEnableBitcoin;
  }
#endif  // CFD_DISABLE_BITCOIN

#ifndef CFD_DISABLE_ELEMENTS
  if (core_functions & cfd::core::LibraryFunction::kEnableElements) {
    support_function |= LibraryFunction::kEnableElements;
  }
#endif  // CFD_DISABLE_ELEMENTS

  return support_function;
}